

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTarget::AddSources
          (cmTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *srcs)

{
  cmTargetInternals *pcVar1;
  bool bVar2;
  cmGeneratorExpression cVar3;
  cmCompiledGeneratorExpression *x;
  pointer pbVar4;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  auto_ptr<cmCompiledGeneratorExpression> local_b0;
  cmGeneratorExpression local_a8;
  string srcFiles;
  string filename;
  cmGeneratorExpression ge;
  
  srcFiles._M_dataplus._M_p = (pointer)&srcFiles.field_2;
  srcFiles._M_string_length = 0;
  srcFiles.field_2._M_local_buf[0] = '\0';
  pbVar4 = (srcs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar4 == (srcs->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      if (srcFiles._M_string_length != 0) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
        ::clear(&(((this->Internal).Pointer)->SourceFilesMap)._M_t);
        this->LinkImplementationLanguageIsContextDependent = true;
        cmMakefile::GetBacktrace((cmListFileBacktrace *)&filename,this->Makefile);
        cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&filename);
        cmGeneratorExpression::Parse(&local_a8,(string *)&ge);
        cVar3.Backtrace = local_a8.Backtrace;
        local_a8.Backtrace = (cmListFileBacktrace *)0x0;
        cge.x_ = (cmCompiledGeneratorExpression *)cVar3.Backtrace;
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                  ((auto_ptr<cmCompiledGeneratorExpression> *)&local_a8);
        *(undefined1 *)
         &cVar3.Backtrace[8].super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
          super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
          super__Vector_impl_data._M_finish = 1;
        pcVar1 = (this->Internal).Pointer;
        local_a8.Backtrace = (cmListFileBacktrace *)operator_new(0x10);
        cge.x_ = (cmCompiledGeneratorExpression *)0x0;
        local_b0.x_ = (cmCompiledGeneratorExpression *)0x0;
        (((cmCompiledGeneratorExpression *)local_a8.Backtrace)->Backtrace).
        super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
        super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)cVar3.Backtrace;
        (((cmCompiledGeneratorExpression *)local_a8.Backtrace)->Backtrace).
        super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
        super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
        std::
        vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
        ::emplace_back<cmTargetInternals::TargetPropertyEntry*>
                  ((vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
                    *)&pcVar1->SourceEntries,(TargetPropertyEntry **)&local_a8);
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_b0);
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
        cmGeneratorExpression::~cmGeneratorExpression(&ge);
        std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
                  ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)&filename);
      }
      break;
    }
    std::__cxx11::string::string((string *)&filename,(string *)pbVar4);
    if ((*filename._M_dataplus._M_p == '$') && (filename._M_dataplus._M_p[1] == '<')) {
LAB_003811fd:
      std::__cxx11::string::append((char *)&srcFiles);
      bVar2 = true;
      std::__cxx11::string::append((string *)&srcFiles);
    }
    else {
      if (filename._M_string_length == 0) {
LAB_003811e7:
        cmMakefile::GetOrCreateSource(this->Makefile,&filename,false);
        goto LAB_003811fd;
      }
      ProcessSourceItemCMP0049((string *)&ge,this,&filename);
      std::__cxx11::string::operator=((string *)&filename,(string *)&ge);
      std::__cxx11::string::~string((string *)&ge);
      if (filename._M_string_length != 0) goto LAB_003811e7;
      bVar2 = false;
    }
    std::__cxx11::string::~string((string *)&filename);
    pbVar4 = pbVar4 + 1;
  } while (bVar2);
  std::__cxx11::string::~string((string *)&srcFiles);
  return;
}

Assistant:

void cmTarget::AddSources(std::vector<std::string> const& srcs)
{
  std::string srcFiles;
  const char* sep = "";
  for(std::vector<std::string>::const_iterator i = srcs.begin();
      i != srcs.end(); ++i)
    {
    std::string filename = *i;
    const char* src = filename.c_str();

    if(!(src[0] == '$' && src[1] == '<'))
      {
      if(!filename.empty())
        {
        filename = this->ProcessSourceItemCMP0049(filename);
        if(filename.empty())
          {
          return;
          }
        }
      this->Makefile->GetOrCreateSource(filename);
      }
    srcFiles += sep;
    srcFiles += filename;
    sep = ";";
    }
  if (!srcFiles.empty())
    {
    this->Internal->SourceFilesMap.clear();
    this->LinkImplementationLanguageIsContextDependent = true;
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(srcFiles);
    cge->SetEvaluateForBuildsystem(true);
    this->Internal->SourceEntries.push_back(
                          new cmTargetInternals::TargetPropertyEntry(cge));
    }
}